

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::ReadableDirectory> __thiscall
kj::ReadableDirectory::openSubdir(ReadableDirectory *this,PathPtr path)

{
  Fault FVar1;
  Clock *clock;
  ReadableDirectory *extraout_RDX;
  Own<const_kj::ReadableDirectory> OVar2;
  Fault f;
  ReadableDirectory *pRStack_50;
  OwnOwn<const_kj::ReadableDirectory> dir;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x58))(&f);
  FVar1 = f;
  dir.value.disposer = (Disposer *)f.exception;
  dir.value.ptr = pRStack_50;
  Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&f);
  if (pRStack_50 == (ReadableDirectory *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x230,FAILED,(char *)0x0,"\"no such file or directory\", path",
               (char (*) [26])"no such file or directory",&path_local);
    kj::_::Debug::Fault::~Fault(&f);
    clock = nullClock();
    newInMemoryDirectory((kj *)&f,clock);
    (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    Own<kj::Directory>::dispose((Own<kj::Directory> *)&f);
  }
  else {
    (this->super_FsNode)._vptr_FsNode = (_func_int **)FVar1.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)pRStack_50;
    dir.value.ptr = (ReadableDirectory *)0x0;
  }
  Own<const_kj::ReadableDirectory>::dispose(&dir.value);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableDirectory> ReadableDirectory::openSubdir(PathPtr path) const {
  KJ_IF_MAYBE(dir, tryOpenSubdir(path)) {
    return kj::mv(*dir);
  } else {
    KJ_FAIL_REQUIRE("no such file or directory", path) { break; }